

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O2

bool anon_unknown.dwarf_842773::LoadCELHeader(FileReader *file,CELHeader *header)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])((char)file,(char)header,0x20);
  if (((CONCAT44(extraout_var,iVar2) == 0x20) && (header->magic == 0x9119)) && (header->width != 0))
  {
    bVar1 = (header->compress == '\0' &&
            (header->depth == '\b' && (header->size != 0 && header->height != 0))) &&
            (uint)header->width * (uint)header->height == header->size;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool LoadCELHeader(FileReader& file, CELHeader& header)
	{
		if (sizeof header != file.Read(&header, sizeof header))
		{
			return false;
		}

		header.magic  = LittleShort(header.magic);
		header.width  = LittleShort(header.width);
		header.height = LittleShort(header.height);
		header.x      = LittleShort(header.x);
		header.y      = LittleShort(header.y);
		header.size   = LittleLong (header.size);

		if (0x9119 != header.magic
			|| 0 == header.width
			|| 0 == header.height
			|| 0 == header.size
			|| header.width * header.height != header.size
			|| 8 != header.depth
			|| 0 != header.compress)
		{
			return false;
		}

		return true;
	}